

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

int predict_skip_txfm(MACROBLOCK *x,BLOCK_SIZE bsize,int64_t *dist,int reduced_tx_set)

{
  int16_t iVar1;
  int iVar2;
  int iVar3;
  int64_t iVar4;
  int in_ECX;
  int iVar5;
  long *in_RDX;
  byte in_SIL;
  long in_RDI;
  uint32_t ac_coef;
  int i;
  uint32_t dc_coef;
  int col;
  int row;
  uint32_t ac_thresh;
  uint32_t dc_thresh;
  int16_t ac_q;
  int n_coeff;
  int16_t *src_diff;
  uint32_t max_qcoef_thresh;
  int bd_idx;
  TxfmParam param;
  tran_low_t coefs [1024];
  int tx_w;
  int tx_h;
  int max_tx_size;
  int64_t pred_err;
  int64_t mse_thresh;
  int16_t normalized_dc_q;
  int64_t mse;
  int16_t dc_q;
  MACROBLOCKD *xd;
  int bh;
  int bw;
  TxfmSearchParams *txfm_params;
  undefined8 in_stack_ffffffffffffeec0;
  TxfmParam *txfm_param;
  int in_stack_ffffffffffffeec8;
  int in_stack_ffffffffffffeecc;
  tran_low_t *in_stack_ffffffffffffeed0;
  int16_t *in_stack_ffffffffffffeed8;
  int local_1120;
  long local_1118;
  int local_1108;
  int local_1100;
  int local_10fc;
  undefined8 in_stack_ffffffffffffef18;
  int in_stack_ffffffffffffef20;
  uint32_t uVar6;
  int in_stack_ffffffffffffef24;
  undefined1 in_stack_ffffffffffffef28;
  undefined1 in_stack_ffffffffffffef29;
  byte tx_size;
  undefined2 in_stack_ffffffffffffef2a;
  undefined4 in_stack_ffffffffffffef2c;
  undefined1 in_stack_ffffffffffffef38;
  undefined7 in_stack_ffffffffffffef39;
  int local_10c0 [1031];
  int local_a4;
  int local_a0;
  uint local_9c;
  long local_98;
  long local_90;
  short local_82;
  long local_80;
  short local_72;
  MACROBLOCKD *local_70;
  uint local_68;
  uint local_64;
  long local_60;
  int local_54;
  long *local_50;
  byte local_41;
  int local_34;
  
  local_60 = in_RDI + 0x24dcc;
  local_64 = (uint)block_size_wide[in_SIL];
  local_68 = (uint)block_size_high[in_SIL];
  local_70 = (MACROBLOCKD *)(in_RDI + 0x1a0);
  local_54 = in_ECX;
  local_50 = in_RDX;
  local_41 = in_SIL;
  local_72 = av1_dc_quant_QTX(in_stack_ffffffffffffeec8,
                              (int)((ulong)in_stack_ffffffffffffeec0 >> 0x20),
                              (aom_bit_depth_t)in_stack_ffffffffffffeec0);
  txfm_param = (TxfmParam *)0x0;
  iVar4 = av1_pixel_diff_dist((MACROBLOCK *)
                              CONCAT44(in_stack_ffffffffffffef2c,
                                       CONCAT22(in_stack_ffffffffffffef2a,
                                                CONCAT11(in_stack_ffffffffffffef29,
                                                         in_stack_ffffffffffffef28))),
                              in_stack_ffffffffffffef24,in_stack_ffffffffffffef20,
                              (int)((ulong)in_stack_ffffffffffffef18 >> 0x20),
                              (BLOCK_SIZE)((ulong)in_stack_ffffffffffffef18 >> 0x18),
                              (BLOCK_SIZE)((ulong)in_stack_ffffffffffffef18 >> 0x10),
                              (uint *)CONCAT71(in_stack_ffffffffffffef39,in_stack_ffffffffffffef38))
  ;
  *local_50 = iVar4;
  local_80 = (*local_50 / (long)(int)local_64) / (long)(int)local_68;
  local_82 = local_72 >> 3;
  local_90 = ((long)local_82 * (long)local_82) / 8;
  local_1118 = local_80;
  if (1 < *(uint *)(local_60 + 0x20)) {
    local_1118 = *local_50;
  }
  local_98 = local_1118;
  if (local_90 < local_1118) {
    local_34 = 0;
  }
  else if (*(uint *)(local_60 + 0x20) < 2) {
    tx_size = ""[local_41];
    local_9c = (uint)tx_size;
    local_a0 = tx_size_high[(int)local_9c];
    local_a4 = tx_size_wide[(int)local_9c];
    is_cur_buf_hbd(local_70);
    iVar2 = is_inter_block((MB_MODE_INFO *)
                           CONCAT44(in_stack_ffffffffffffeecc,in_stack_ffffffffffffeec8));
    av1_get_ext_tx_set_type(tx_size,iVar2,local_54);
    if (local_70->bd == 8) {
      local_1120 = 0;
    }
    else {
      local_1120 = 2;
      if (local_70->bd == 10) {
        local_1120 = 1;
      }
    }
    uVar6 = skip_pred_threshold[local_1120][local_41];
    iVar2 = local_a4 * local_a0;
    iVar1 = av1_ac_quant_QTX(in_stack_ffffffffffffeec8,(int)((ulong)txfm_param >> 0x20),
                             (aom_bit_depth_t)txfm_param);
    iVar5 = (int)local_72;
    for (local_10fc = 0; local_10fc < (int)local_68; local_10fc = local_a0 + local_10fc) {
      for (local_1100 = 0; local_1100 < (int)local_64; local_1100 = local_a4 + local_1100) {
        av1_fwd_txfm(in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,in_stack_ffffffffffffeecc,
                     txfm_param);
        iVar3 = local_10c0[0];
        if (local_10c0[0] < 1) {
          iVar3 = -local_10c0[0];
        }
        if (uVar6 * iVar5 <= (uint)(iVar3 << 7)) {
          return 0;
        }
        for (local_1108 = 1; local_1108 < iVar2; local_1108 = local_1108 + 1) {
          iVar3 = local_10c0[local_1108];
          if (iVar3 < 1) {
            iVar3 = -iVar3;
          }
          if (uVar6 * (int)iVar1 <= (uint)(iVar3 << 7)) {
            return 0;
          }
        }
      }
    }
    local_34 = 1;
  }
  else {
    local_34 = 1;
  }
  return local_34;
}

Assistant:

static int predict_skip_txfm(MACROBLOCK *x, BLOCK_SIZE bsize, int64_t *dist,
                             int reduced_tx_set) {
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const MACROBLOCKD *xd = &x->e_mbd;
  const int16_t dc_q = av1_dc_quant_QTX(x->qindex, 0, xd->bd);

  *dist = av1_pixel_diff_dist(x, 0, 0, 0, bsize, bsize, NULL);

  const int64_t mse = *dist / bw / bh;
  // Normalized quantizer takes the transform upscaling factor (8 for tx size
  // smaller than 32) into account.
  const int16_t normalized_dc_q = dc_q >> 3;
  const int64_t mse_thresh = (int64_t)normalized_dc_q * normalized_dc_q / 8;
  // For faster early skip decision, use dist to compare against threshold so
  // that quality risk is less for the skip=1 decision. Otherwise, use mse
  // since the fwd_txfm coeff checks will take care of quality
  // TODO(any): Use dist to return 0 when skip_txfm_level is 1
  int64_t pred_err = (txfm_params->skip_txfm_level >= 2) ? *dist : mse;
  // Predict not to skip when error is larger than threshold.
  if (pred_err > mse_thresh) return 0;
  // Return as skip otherwise for aggressive early skip
  else if (txfm_params->skip_txfm_level >= 2)
    return 1;

  const int max_tx_size = max_predict_sf_tx_size[bsize];
  const int tx_h = tx_size_high[max_tx_size];
  const int tx_w = tx_size_wide[max_tx_size];
  DECLARE_ALIGNED(32, tran_low_t, coefs[32 * 32]);
  TxfmParam param;
  param.tx_type = DCT_DCT;
  param.tx_size = max_tx_size;
  param.bd = xd->bd;
  param.is_hbd = is_cur_buf_hbd(xd);
  param.lossless = 0;
  param.tx_set_type = av1_get_ext_tx_set_type(
      param.tx_size, is_inter_block(xd->mi[0]), reduced_tx_set);
  const int bd_idx = (xd->bd == 8) ? 0 : ((xd->bd == 10) ? 1 : 2);
  const uint32_t max_qcoef_thresh = skip_pred_threshold[bd_idx][bsize];
  const int16_t *src_diff = x->plane[0].src_diff;
  const int n_coeff = tx_w * tx_h;
  const int16_t ac_q = av1_ac_quant_QTX(x->qindex, 0, xd->bd);
  const uint32_t dc_thresh = max_qcoef_thresh * dc_q;
  const uint32_t ac_thresh = max_qcoef_thresh * ac_q;
  for (int row = 0; row < bh; row += tx_h) {
    for (int col = 0; col < bw; col += tx_w) {
      av1_fwd_txfm(src_diff + col, coefs, bw, &param);
      // Operating on TX domain, not pixels; we want the QTX quantizers
      const uint32_t dc_coef = (((uint32_t)abs(coefs[0])) << 7);
      if (dc_coef >= dc_thresh) return 0;
      for (int i = 1; i < n_coeff; ++i) {
        const uint32_t ac_coef = (((uint32_t)abs(coefs[i])) << 7);
        if (ac_coef >= ac_thresh) return 0;
      }
    }
    src_diff += tx_h * bw;
  }
  return 1;
}